

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

Literals * __thiscall
anon_unknown.dwarf_5fce8::CtorEvalExternalInterface::callImport
          (Literals *__return_storage_ptr__,CtorEvalExternalInterface *this,Function *import,
          Literals *arguments)

{
  char **this_00;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var1;
  int32_t iVar2;
  string *psVar3;
  char *pcVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  initializer_list<wasm::Literal> init;
  initializer_list<wasm::Literal> init_00;
  initializer_list<wasm::Literal> init_01;
  initializer_list<wasm::Literal> init_02;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  Name WASI;
  string extra;
  
  wasm::Name::Name((Name *)local_68,"wasi_snapshot_preview1");
  if (((anonymous_namespace)::ignoreExternalInput == '\x01') &&
     ((import->super_Importable).module.super_IString.str._M_str ==
      (char *)WASI.super_IString.str._M_len)) {
    this_00 = &WASI.super_IString.str._M_str;
    wasm::IString::IString((IString *)this_00,"environ_sizes_get");
    if ((import->super_Importable).base.super_IString.str._M_str == extra._M_dataplus._M_p) {
      if (((((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x18 +
            (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed != 2) ||
          ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id != 2)) ||
         (wasm::HeapType::getSignature(), extraout_RDX_00 != 2)) {
        psVar3 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1c8,"wasi environ_sizes_get has wrong sig",
                   (allocator<char> *)&WASI.super_IString.str._M_str);
        std::__cxx11::string::string(psVar3,local_1c8);
        __cxa_throw(psVar3,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      iVar2 = wasm::Literal::geti32
                        ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
      _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
      (*(this->super_ExternalInterface)._vptr_ExternalInterface[0x18])
                (this,(long)iVar2,0,
                 *(undefined8 *)
                  _Var1._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
                 *(undefined8 *)
                  ((long)_Var1._M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8));
      WASI.super_IString.str._M_str = (char *)((ulong)WASI.super_IString.str._M_str._4_4_ << 0x20);
      extra._M_string_length = 2;
      init_00._M_len = 1;
      init_00._M_array = (iterator)&WASI.super_IString.str._M_str;
      wasm::Literals::Literals(__return_storage_ptr__,init_00);
LAB_00136d65:
      wasm::Literal::~Literal((Literal *)&WASI.super_IString.str._M_str);
      return __return_storage_ptr__;
    }
    wasm::IString::IString((IString *)this_00,"environ_get");
    if ((import->super_Importable).base.super_IString.str._M_str == extra._M_dataplus._M_p) {
      if (((((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x18 +
            (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed != 2) ||
          ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id != 2)) ||
         (wasm::HeapType::getSignature(), extraout_RDX_01 != 2)) {
        psVar3 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1a8,"wasi environ_get has wrong sig",
                   (allocator<char> *)&WASI.super_IString.str._M_str);
        std::__cxx11::string::string(psVar3,local_1a8);
        __cxa_throw(psVar3,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      WASI.super_IString.str._M_str = (char *)((ulong)WASI.super_IString.str._M_str._4_4_ << 0x20);
      extra._M_string_length = 2;
      init_01._M_len = 1;
      init_01._M_array = (iterator)&WASI.super_IString.str._M_str;
      wasm::Literals::Literals(__return_storage_ptr__,init_01);
      goto LAB_00136d65;
    }
    wasm::IString::IString((IString *)this_00,"args_sizes_get");
    if ((import->super_Importable).base.super_IString.str._M_str == extra._M_dataplus._M_p) {
      if (((((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x18 +
            (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed != 2) ||
          ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id != 2)) ||
         (wasm::HeapType::getSignature(), extraout_RDX_02 != 2)) {
        psVar3 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_188,"wasi args_sizes_get has wrong sig",
                   (allocator<char> *)&WASI.super_IString.str._M_str);
        std::__cxx11::string::string(psVar3,local_188);
        __cxa_throw(psVar3,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      iVar2 = wasm::Literal::geti32
                        ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
      _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
      (*(this->super_ExternalInterface)._vptr_ExternalInterface[0x18])
                (this,(long)iVar2,0,
                 *(undefined8 *)
                  _Var1._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
                 *(undefined8 *)
                  ((long)_Var1._M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8));
      WASI.super_IString.str._M_str = (char *)((ulong)WASI.super_IString.str._M_str._4_4_ << 0x20);
      extra._M_string_length = 2;
      init_02._M_len = 1;
      init_02._M_array = (iterator)&WASI.super_IString.str._M_str;
      wasm::Literals::Literals(__return_storage_ptr__,init_02);
      goto LAB_00136d65;
    }
    wasm::IString::IString((IString *)&WASI.super_IString.str._M_str,"args_get");
    if ((import->super_Importable).base.super_IString.str._M_str == extra._M_dataplus._M_p) {
      if (((((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x18 +
            (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed != 2) ||
          ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id != 2)) ||
         (wasm::HeapType::getSignature(), extraout_RDX != 2)) {
        psVar3 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_168,"wasi args_get has wrong sig",
                   (allocator<char> *)&WASI.super_IString.str._M_str);
        std::__cxx11::string::string(psVar3,local_168);
        __cxa_throw(psVar3,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      WASI.super_IString.str._M_str = (char *)((ulong)WASI.super_IString.str._M_str._4_4_ << 0x20);
      extra._M_string_length = 2;
      init._M_len = 1;
      init._M_array = (iterator)&WASI.super_IString.str._M_str;
      wasm::Literals::Literals(__return_storage_ptr__,init);
      goto LAB_00136d65;
    }
  }
  WASI.super_IString.str._M_str = (char *)&extra._M_string_length;
  extra._M_dataplus._M_p = (pointer)0x0;
  extra._M_string_length = extra._M_string_length & 0xffffffffffffff00;
  pcVar4 = (import->super_Importable).module.super_IString.str._M_str;
  if (pcVar4 == _sqrt) {
    wasm::IString::IString((IString *)&local_88,"___cxa_atexit");
    if ((import->super_Importable).base.super_IString.str._M_str !=
        (char *)local_88._M_string_length) {
      pcVar4 = (import->super_Importable).module.super_IString.str._M_str;
      goto LAB_00136f1e;
    }
  }
  else {
LAB_00136f1e:
    if ((pcVar4 != (char *)WASI.super_IString.str._M_len) ||
       ((anonymous_namespace)::ignoreExternalInput != '\0')) goto LAB_00136f3d;
  }
  std::__cxx11::string::assign((char *)&WASI.super_IString.str._M_str);
LAB_00136f3d:
  psVar3 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"call import: ",
             (allocator<char> *)(extra.field_2._M_local_buf + 0xf));
  wasm::IString::toString_abi_cxx11_(&local_c8,&(import->super_Importable).module.super_IString);
  std::operator+(&local_108,&local_e8,&local_c8);
  std::operator+(&local_128,&local_108,".");
  wasm::IString::toString_abi_cxx11_(&local_a8,&(import->super_Importable).base.super_IString);
  std::operator+(&local_88,&local_128,&local_a8);
  std::operator+(&local_148,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &WASI.super_IString.str._M_str);
  std::__cxx11::string::string(psVar3,(string *)&local_148);
  __cxa_throw(psVar3,&(anonymous_namespace)::FailToEvalException::typeinfo,
              FailToEvalException::~FailToEvalException);
}

Assistant:

Literals callImport(Function* import, const Literals& arguments) override {
    Name WASI("wasi_snapshot_preview1");

    if (ignoreExternalInput) {
      if (import->module == WASI) {
        if (import->base == "environ_sizes_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi environ_sizes_get has wrong sig");
          }

          // Write out a count of i32(0) and return __WASI_ERRNO_SUCCESS (0).
          store32(arguments[0].geti32(), 0, wasm->memories[0]->name);
          return {Literal(int32_t(0))};
        }

        if (import->base == "environ_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi environ_get has wrong sig");
          }

          // Just return __WASI_ERRNO_SUCCESS (0).
          return {Literal(int32_t(0))};
        }

        if (import->base == "args_sizes_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi args_sizes_get has wrong sig");
          }

          // Write out an argc of i32(0) and return a __WASI_ERRNO_SUCCESS (0).
          store32(arguments[0].geti32(), 0, wasm->memories[0]->name);
          return {Literal(int32_t(0))};
        }

        if (import->base == "args_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi args_get has wrong sig");
          }

          // Just return __WASI_ERRNO_SUCCESS (0).
          return {Literal(int32_t(0))};
        }

        // Otherwise, we don't recognize this import; continue normally to
        // error.
      }
    }

    std::string extra;
    if (import->module == ENV && import->base == "___cxa_atexit") {
      extra = RECOMMENDATION "build with -s NO_EXIT_RUNTIME=1 so that calls "
                             "to atexit are not emitted";
    } else if (import->module == WASI && !ignoreExternalInput) {
      extra = RECOMMENDATION "consider --ignore-external-input";
    }
    throw FailToEvalException(std::string("call import: ") +
                              import->module.toString() + "." +
                              import->base.toString() + extra);
  }